

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(Epnp *this,double (*R) [3],double *t)

{
  Index IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  byte bVar12;
  bool bVar13;
  Index size;
  double *pdVar14;
  double *pdVar15;
  undefined8 unaff_RBP;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  Index index_1;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double *pdVar22;
  double *pdVar23;
  Index *pIVar24;
  Index *pIVar25;
  long lVar26;
  ulong uVar27;
  double dVar28;
  double dVar33;
  double dVar34;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar35;
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  MatrixXd Abt;
  MatrixXd Abt_v;
  MatrixXd Abt_u;
  MatrixXd Abt_v_prime;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  double local_308;
  double dStack_300;
  double dStack_2f8;
  double local_2e8 [4];
  DenseStorage<double,__1,__1,__1,_0> local_2c8;
  DenseStorage<double,__1,__1,__1,_0> local_2b0;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  double *local_280;
  DenseStorage<double,__1,__1,__1,_0> local_278;
  undefined1 *local_260;
  undefined1 local_258 [8];
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_250;
  
  local_2e8[0] = 0.0;
  local_2e8[1] = 0.0;
  local_2e8[2] = 0.0;
  local_308 = 0.0;
  dStack_300 = 0.0;
  dStack_2f8 = 0.0;
  iVar11 = this->number_of_correspondences;
  if (0 < (long)iVar11) {
    lVar17 = 0;
    do {
      pdVar15 = (double *)((long)this->pcs + lVar17);
      local_2e8[0] = *pdVar15 + local_2e8[0];
      local_2e8[1] = pdVar15[1] + local_2e8[1];
      local_2e8[2] = pdVar15[2] + local_2e8[2];
      pdVar15 = (double *)((long)this->pws + lVar17);
      local_308 = *pdVar15 + local_308;
      dStack_300 = pdVar15[1] + dStack_300;
      dStack_2f8 = pdVar15[2] + dStack_2f8;
      lVar17 = lVar17 + 0x18;
    } while ((long)iVar11 * 0x18 != lVar17);
  }
  auVar42._0_8_ = (double)iVar11;
  auVar42._8_8_ = auVar42._0_8_;
  auVar42._16_8_ = auVar42._0_8_;
  auVar42._24_8_ = auVar42._0_8_;
  uVar18 = CONCAT71((int7)((ulong)unaff_RBP >> 8),7);
  uVar27 = uVar18 & 0xffffffff;
  bVar12 = (byte)uVar27;
  auVar30._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * (long)local_2e8[1];
  auVar30._0_8_ = (ulong)(bVar12 & 1) * (long)local_2e8[0];
  auVar30._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * (long)local_2e8[2];
  auVar30._24_8_ = 0;
  auVar31 = vdivpd_avx(auVar30,auVar42);
  local_2e8[0] = (double)((ulong)(bVar12 & 1) * auVar31._0_8_ |
                         (ulong)!(bool)(bVar12 & 1) * (long)local_2e8[0]);
  bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
  local_2e8[1] = (double)((ulong)bVar13 * auVar31._8_8_ | (ulong)!bVar13 * (long)local_2e8[1]);
  bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
  local_2e8[2] = (double)((ulong)bVar13 * auVar31._16_8_ | (ulong)!bVar13 * (long)local_2e8[2]);
  auVar29._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * (long)dStack_300;
  auVar29._0_8_ = (ulong)(bVar12 & 1) * (long)local_308;
  auVar29._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * (long)dStack_2f8;
  auVar29._24_8_ = 0;
  auVar31 = vdivpd_avx(auVar29,auVar42);
  dVar28 = (double)((ulong)(bVar12 & 1) * auVar31._0_8_ |
                   (ulong)!(bool)(bVar12 & 1) * (long)local_308);
  bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
  dVar33 = (double)((ulong)bVar13 * auVar31._8_8_ | (ulong)!bVar13 * (long)dStack_300);
  bVar13 = (bool)((byte)(uVar27 >> 2) & 1);
  dVar34 = (double)((ulong)bVar13 * auVar31._16_8_ | (ulong)!bVar13 * (long)dStack_2f8);
  local_2c8.m_data = (double *)0x0;
  local_2c8.m_rows = 0;
  local_2c8.m_cols = 0;
  local_280 = t;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_2c8,9,3,3);
  auVar38._8_8_ = local_2c8.m_rows;
  auVar38._0_8_ = local_2c8.m_rows;
  auVar38._16_8_ = local_2c8.m_rows;
  auVar38._24_8_ = local_2c8.m_rows;
  auVar30 = vpmullq_avx512vl(auVar38,_DAT_001fec40);
  auVar31._8_8_ = local_2c8.m_data;
  auVar31._0_8_ = local_2c8.m_data;
  auVar31._16_8_ = local_2c8.m_data;
  auVar31._24_8_ = local_2c8.m_data;
  auVar31 = vpaddq_avx512vl(auVar30,auVar31);
  lVar17 = 0;
  do {
    auVar30 = vpbroadcastq_avx512vl();
    auVar30 = vpsllq_avx2(auVar30,3);
    auVar30 = vpaddq_avx2(auVar31,auVar30);
    vscatterqpd_avx512vl(ZEXT832(0) + auVar30,uVar18 & 0xffffffff,ZEXT832(0) << 0x40);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  iVar11 = this->number_of_correspondences;
  if (0 < (long)iVar11) {
    pdVar15 = this->pws;
    pdVar14 = this->pcs;
    lVar17 = 0;
    do {
      lVar26 = 3;
      pdVar16 = local_2e8;
      pdVar22 = local_2c8.m_data;
      pdVar23 = pdVar14;
      do {
        dVar35 = *pdVar16;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pdVar22;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *pdVar23 - dVar35;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = pdVar15[lVar17 * 3] - dVar28;
        auVar2 = vfmadd213sd_fma(auVar45,auVar53,auVar2);
        *pdVar22 = auVar2._0_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar22[local_2c8.m_rows];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *pdVar23 - dVar35;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = pdVar15[lVar17 * 3 + 1] - dVar33;
        auVar2 = vfmadd213sd_fma(auVar46,auVar54,auVar3);
        pdVar22[local_2c8.m_rows] = auVar2._0_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pdVar22[local_2c8.m_rows * 2];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *pdVar23 - dVar35;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = pdVar15[lVar17 * 3 + 2] - dVar34;
        auVar2 = vfmadd213sd_fma(auVar47,auVar55,auVar4);
        pdVar22[local_2c8.m_rows * 2] = auVar2._0_8_;
        pdVar16 = pdVar16 + 1;
        pdVar23 = pdVar23 + 1;
        pdVar22 = pdVar22 + 1;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
      lVar17 = lVar17 + 1;
      pdVar14 = pdVar14 + 3;
    } while (lVar17 != iVar11);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_250,(MatrixType *)&local_2c8,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_298,(DenseStorage<double,__1,__1,__1,_0> *)&local_250);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_2b0,
             (DenseStorage<double,__1,__1,__1,_0> *)
             &local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV);
  local_278.m_data = (double *)&local_278.m_rows;
  pdVar15 = local_298.m_data + local_298.m_rows;
  lVar17 = 0;
  do {
    lVar26 = 0;
    pdVar14 = local_2b0.m_data + local_2b0.m_rows;
    do {
      if (local_2b0.m_cols == 0) {
        dVar35 = 0.0;
      }
      else {
        dVar35 = local_298.m_data[lVar17] * local_2b0.m_data[lVar26];
        lVar20 = local_2b0.m_cols + -1;
        pdVar16 = pdVar15;
        pdVar22 = pdVar14;
        if (1 < local_2b0.m_cols) {
          do {
            dVar35 = dVar35 + *pdVar16 * *pdVar22;
            lVar20 = lVar20 + -1;
            pdVar16 = pdVar16 + local_298.m_rows;
            pdVar22 = pdVar22 + local_2b0.m_rows;
          } while (lVar20 != 0);
        }
      }
      R[lVar17][lVar26] = dVar35;
      lVar26 = lVar26 + 1;
      pdVar14 = pdVar14 + 1;
    } while (lVar26 != 3);
    lVar17 = lVar17 + 1;
    pdVar15 = pdVar15 + 1;
  } while (lVar17 != 3);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = R[2][2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = R[2][0];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = (*R)[0] * R[1][1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = (*R)[1] * R[1][2] * R[2][0];
  auVar2 = vfmadd231sd_fma(auVar56,auVar51,auVar48);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = R[2][1];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = R[1][0] * (*R)[2];
  auVar2 = vfmadd213sd_fma(auVar58,auVar59,auVar2);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = R[1][1] * (*R)[2];
  auVar2 = vfnmadd213sd_fma(auVar36,auVar57,auVar2);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = R[1][0] * (*R)[1];
  auVar2 = vfnmadd213sd_fma(auVar43,auVar51,auVar2);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = R[1][2] * (*R)[0];
  auVar2 = vfnmadd213sd_fma(auVar37,auVar59,auVar2);
  if (auVar2._0_8_ < 0.0) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_278,&local_2b0);
    pIVar24 = (Index *)(local_278.m_data + local_278.m_rows * 2);
    uVar18 = local_278.m_rows;
    if ((((ulong)pIVar24 & 7) == 0) &&
       (uVar18 = (ulong)(-((uint)((ulong)pIVar24 >> 3) & 0x1fffffff) & 7),
       local_278.m_rows <= (long)uVar18)) {
      uVar18 = local_278.m_rows;
    }
    uVar19 = local_278.m_rows - uVar18;
    uVar27 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar27 = uVar19;
    }
    if (0 < (long)uVar18) {
      uVar21 = 0;
      do {
        auVar39._0_8_ = -local_2b0.m_data[local_2b0.m_rows * 2 + uVar21];
        auVar39._8_8_ = 0x8000000000000000;
        IVar1 = vmovlpd_avx(auVar39);
        pIVar24[uVar21] = IVar1;
        uVar21 = uVar21 + 1;
      } while (uVar18 != uVar21);
    }
    uVar27 = (uVar27 & 0xfffffffffffffff8) + uVar18;
    if (7 < (long)uVar19) {
      do {
        auVar32 = vsubpd_avx512f(ZEXT864(0) << 0x40,
                                 *(undefined1 (*) [64])
                                  (local_2b0.m_data + local_2b0.m_rows * 2 + uVar18));
        *(undefined1 (*) [64])(pIVar24 + uVar18) = auVar32;
        uVar18 = uVar18 + 8;
      } while ((long)uVar18 < (long)uVar27);
    }
    if ((long)uVar27 < local_278.m_rows) {
      do {
        auVar40._0_8_ = -local_2b0.m_data[local_2b0.m_rows * 2 + uVar27];
        auVar40._8_8_ = 0x8000000000000000;
        IVar1 = vmovlpd_avx(auVar40);
        pIVar24[uVar27] = IVar1;
        uVar27 = uVar27 + 1;
      } while (local_278.m_rows != uVar27);
    }
    local_260 = local_258;
    pdVar15 = local_298.m_data + local_298.m_rows;
    lVar17 = 0;
    do {
      lVar26 = 0;
      pIVar24 = (Index *)(local_278.m_data + local_278.m_rows);
      do {
        if (local_278.m_cols == 0) {
          dVar35 = 0.0;
        }
        else {
          dVar35 = local_298.m_data[lVar17] * local_278.m_data[lVar26];
          pdVar14 = pdVar15;
          lVar20 = local_278.m_cols + -1;
          pIVar25 = pIVar24;
          if (1 < local_278.m_cols) {
            do {
              dVar35 = dVar35 + *pdVar14 * (double)*pIVar25;
              lVar20 = lVar20 + -1;
              pdVar14 = pdVar14 + local_298.m_rows;
              pIVar25 = pIVar25 + local_278.m_rows;
            } while (lVar20 != 0);
          }
        }
        R[lVar17][lVar26] = dVar35;
        lVar26 = lVar26 + 1;
        pIVar24 = pIVar24 + 1;
      } while (lVar26 != 3);
      lVar17 = lVar17 + 1;
      pdVar15 = pdVar15 + 1;
    } while (lVar17 != 3);
    if (local_278.m_data != (double *)0x0) {
      free(((DenseStorage<double,__1,__1,__1,_0> *)(local_278.m_data + -1))->m_data);
    }
  }
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar28;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (*R)[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar33 * (*R)[1];
  auVar2 = vfmadd231sd_fma(auVar49,auVar41,auVar5);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar34;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (*R)[2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar52,auVar6);
  *local_280 = local_2e8[0] - auVar2._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = R[1][0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar33 * R[1][1];
  auVar2 = vfmadd231sd_fma(auVar50,auVar41,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = R[1][2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar52,auVar8);
  local_280[1] = local_2e8[1] - auVar2._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = R[2][0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar33 * R[2][1];
  auVar2 = vfmadd231sd_fma(auVar44,auVar41,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = R[2][2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar52,auVar10);
  local_280[2] = local_2e8[2] - auVar2._0_8_;
  if (local_2b0.m_data != (double *)0x0) {
    free((void *)local_2b0.m_data[-1]);
  }
  if (local_298.m_data != (double *)0x0) {
    free((void *)local_298.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_250);
  if (local_2c8.m_data != (double *)0x0) {
    free((void *)local_2c8.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(
    double R[3][3],
    double t[3])
{
  double pc0[3], pw0[3];

  pc0[0] = pc0[1] = pc0[2] = 0.0;
  pw0[0] = pw0[1] = pw0[2] = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    const double * pc = pcs + 3 * i;
    const double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      pc0[j] += pc[j];
      pw0[j] += pw[j];
    }
  }
  for(int j = 0; j < 3; j++)
  {
    pc0[j] /= number_of_correspondences;
    pw0[j] /= number_of_correspondences;
  }

  Eigen::MatrixXd Abt(3,3);

  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      Abt(i,j) = 0.0;
  }

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pc = pcs + 3 * i;
    double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      Abt(j,0) += (pc[j] - pc0[j]) * (pw[0] - pw0[0]);
      Abt(j,1) += (pc[j] - pc0[j]) * (pw[1] - pw0[1]);
      Abt(j,2) += (pc[j] - pc0[j]) * (pw[2] - pw0[2]);
    }
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      Abt,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd Abt_u = SVD.matrixU();
  Eigen::MatrixXd Abt_v = SVD.matrixV();

  for(int i = 0; i < 3; i++)
    for(int j = 0; j < 3; j++)
      R[i][j] = Abt_u.row(i) * Abt_v.row(j).transpose();

  const double det =
      R[0][0] * R[1][1] * R[2][2] +
      R[0][1] * R[1][2] * R[2][0] +
      R[0][2] * R[1][0] * R[2][1] -
      R[0][2] * R[1][1] * R[2][0] -
      R[0][1] * R[1][0] * R[2][2] -
      R[0][0] * R[1][2] * R[2][1];

  //change 1: negative determinant problem is solved by changing Abt_v, not R

  if (det < 0)
  {
    //R[2][0] = -R[2][0];
    //R[2][1] = -R[2][1];
    //R[2][2] = -R[2][2];
    Eigen::MatrixXd Abt_v_prime = Abt_v;
    Abt_v_prime.col(2) = -Abt_v.col(2);
    for(int i = 0; i < 3; i++)
      for(int j = 0; j < 3; j++)
        R[i][j] = Abt_u.row(i) * Abt_v_prime.row(j).transpose();
  }

  t[0] = pc0[0] - dot(R[0], pw0);
  t[1] = pc0[1] - dot(R[1], pw0);
  t[2] = pc0[2] - dot(R[2], pw0);
}